

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O1

int cuddComputeFloorLog2(uint value)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = 0;
  if (1 < value) {
    iVar2 = 0;
    do {
      iVar2 = iVar2 + 1;
      bVar1 = 3 < value;
      value = value >> 1;
    } while (bVar1);
  }
  return iVar2;
}

Assistant:

int
cuddComputeFloorLog2(
  unsigned int value)
{
    int floorLog = 0;
#ifdef DD_DEBUG
    assert(value > 0);
#endif
    while (value > 1) {
        floorLog++;
        value >>= 1;
    }
    return(floorLog);

}